

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O1

void __thiscall
solitaire::events::SDLEventsSourceTests_returnQuitEvent_Test::TestBody
          (SDLEventsSourceTests_returnQuitEvent_Test *this)

{
  TypedExpectation<int_(SDL_Event_&)> *this_00;
  _func_int__Any_data_ptr_SDL_Event_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data *this_01;
  _Any_data *p_Var1;
  char *message;
  AssertionResult gtest_ar;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined8 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  undefined8 local_58;
  undefined8 local_50;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_48;
  MatcherBase<SDL_Event_&> local_40;
  MatcherBase<SDL_Event_&> local_28;
  
  this_01 = &local_88;
  p_Var1 = &local_88;
  local_28.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032a2c0;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)&local_48,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_28
            );
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                      ((MockSpec<int_(SDL_Event_&)> *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                       ,100,"*sdlMock","pollEvent(_)");
  local_50 = 0;
  local_58 = 0;
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = 0;
  pcStack_70 = std::
               _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:100:57)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:100:57)>
             ::_M_manager;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = (void *)0x0;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (this_00,(Action<int_(SDL_Event_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
    this_01 = p_Var1;
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_40);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_28);
  local_48 = (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              )SDLEventsSource::getEvent
                         ((Event *)&(this->super_SDLEventsSourceTests).eventsSource,
                          (SDLEventsSource *)this_01);
  std::
  get<4ul,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
            ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              *)&local_48);
  testing::AssertionSuccess();
  if ((char)local_68 == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (pbStack_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (pbStack_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x69,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_48 !=
        (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
         )0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_60,pbStack_60);
  }
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnQuitEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_QUIT;
        return 1;
    }));

    EXPECT_EQ(std::get<Quit>(eventsSource.getEvent()), Quit {});
}